

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom32.cc
# Opt level: O0

int atom32_prep_grid(hwtest_ctx *ctx,uint32_t xtra)

{
  int iVar1;
  undefined1 local_15;
  uint32_t xtra_local;
  hwtest_ctx *ctx_local;
  
  iVar1 = g80_gr_mthd(ctx,3,0x3a8,0x40);
  local_15 = true;
  if (iVar1 == 0) {
    iVar1 = g80_gr_mthd(ctx,3,0x3ac,0x10200);
    local_15 = true;
    if (iVar1 == 0) {
      iVar1 = g80_gr_mthd(ctx,3,0x3b0,1);
      local_15 = true;
      if (iVar1 == 0) {
        iVar1 = g80_gr_mthd(ctx,3,0x2c0,8);
        local_15 = true;
        if (iVar1 == 0) {
          iVar1 = g80_gr_mthd(ctx,3,0x2b4,0x10200);
          local_15 = true;
          if (iVar1 == 0) {
            iVar1 = g80_gr_mthd(ctx,3,0x2b8,1);
            local_15 = true;
            if (iVar1 == 0) {
              iVar1 = g80_gr_mthd(ctx,3,0x3b8,2);
              local_15 = true;
              if (iVar1 == 0) {
                iVar1 = g80_gr_mthd(ctx,3,0x2f8,1);
                local_15 = true;
                if (iVar1 == 0) {
                  iVar1 = g80_gr_mthd(ctx,3,0x388,0);
                  local_15 = true;
                  if (iVar1 == 0) {
                    iVar1 = g80_gr_mthd(ctx,3,0x3a4,0x10001);
                    local_15 = true;
                    if (iVar1 == 0) {
                      iVar1 = g80_gr_mthd(ctx,3,0x374,0);
                      local_15 = true;
                      if (iVar1 == 0) {
                        iVar1 = g80_gr_mthd(ctx,3,900,0x100);
                        local_15 = true;
                        if (iVar1 == 0) {
                          iVar1 = g80_gr_mthd(ctx,3,0x37c,xtra & 1 | (xtra & 2) << 0xf);
                          local_15 = iVar1 != 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (int)local_15;
}

Assistant:

static int atom32_prep_grid(struct hwtest_ctx *ctx, uint32_t xtra) {
	return
		/* CTA config. */
		g80_gr_mthd(ctx, 3, 0x3a8, 0x40) ||
		g80_gr_mthd(ctx, 3, 0x3ac, 0x00010200) ||
		g80_gr_mthd(ctx, 3, 0x3b0, 0x00000001) ||
		g80_gr_mthd(ctx, 3, 0x2c0, 0x00000008) || /* regs */
		g80_gr_mthd(ctx, 3, 0x2b4, 0x00010200) || /* threads & barriers */
		g80_gr_mthd(ctx, 3, 0x2b8, 0x00000001) ||
		g80_gr_mthd(ctx, 3, 0x3b8, 0x00000002) ||
		g80_gr_mthd(ctx, 3, 0x2f8, 0x00000001) || /* init */
		/* Grid config. */
		g80_gr_mthd(ctx, 3, 0x388, 0) ||
		g80_gr_mthd(ctx, 3, 0x3a4, 0x00010001) ||
		g80_gr_mthd(ctx, 3, 0x374, 0) ||
		g80_gr_mthd(ctx, 3, 0x384, 0x100) ||
		/* Funny stuff */
		g80_gr_mthd(ctx, 3, 0x37c, (xtra & 1) | (xtra << 15 & 0x10000));
}